

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void on_read_closed_handle(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  char *pcVar1;
  
  if ((nread != -0xfff) && (nread != 0)) {
    if (nread < 0) {
      pcVar1 = uv_strerror((int)nread);
      printf("error recving on channel: %s\n",pcVar1);
      abort();
    }
    closed_handle_data_read = closed_handle_data_read + (int)nread;
  }
  free(buf->base);
  return;
}

Assistant:

static void on_read_closed_handle(uv_stream_t* handle,
                                  ssize_t nread,
                                  const uv_buf_t* buf) {
  if (nread == 0 || nread == UV_EOF) {
    free(buf->base);
    return;
  }

  if (nread < 0) {
    printf("error recving on channel: %s\n", uv_strerror(nread));
    abort();
  }

  closed_handle_data_read += nread;
  free(buf->base);
}